

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

int Extra_bddVarIsInCube(DdNode *bCube,int iVar)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *pDVar6;
  
  do {
    while( true ) {
      piVar3 = (int *)((ulong)bCube & 0xfffffffffffffffe);
      iVar1 = *piVar3;
      if (iVar1 == 0x7fffffff) {
        return -1;
      }
      uVar2 = *(ulong *)(piVar3 + 6);
      uVar5 = (ulong)((uint)bCube & 1);
      pDVar4 = (DdNode *)(uVar5 ^ uVar2);
      pDVar6 = (DdNode *)(uVar5 ^ *(ulong *)(piVar3 + 4));
      if ((((ulong)pDVar4 & 1) == 0) || (*(int *)(uVar2 & 0xfffffffffffffffe) != 0x7fffffff)) break;
      bCube = pDVar6;
      if (iVar1 == iVar) {
LAB_00683c11:
        return (uint)(*(int *)(uVar2 & 0xfffffffffffffffe) == 0x7fffffff);
      }
    }
    if ((((ulong)pDVar6 & 1) == 0) ||
       (*(int *)(*(ulong *)(piVar3 + 4) & 0xfffffffffffffffe) != 0x7fffffff)) {
      __assert_fail("(Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) || (Cudd_IsComplement(bCube1) && Cudd_Regular(bCube1)->index == CUDD_CONST_INDEX)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddMisc.c"
                    ,0x429,"int Extra_bddVarIsInCube(DdNode *, int)");
    }
    if (iVar1 == iVar) {
      if (((ulong)pDVar4 & 1) == 0) {
        return 0;
      }
      goto LAB_00683c11;
    }
    bCube = pDVar4;
    if ((((ulong)pDVar4 & 1) != 0) &&
       (bCube = pDVar6, *(int *)(uVar2 & 0xfffffffffffffffe) != 0x7fffffff)) {
      bCube = pDVar4;
    }
  } while( true );
}

Assistant:

int Extra_bddVarIsInCube( DdNode * bCube, int iVar )
{
    DdNode * bCube0, * bCube1;
    while ( Cudd_Regular(bCube)->index != CUDD_CONST_INDEX )
    {
        bCube0 = Cudd_NotCond( cuddE(Cudd_Regular(bCube)), Cudd_IsComplement(bCube) );
        bCube1 = Cudd_NotCond( cuddT(Cudd_Regular(bCube)), Cudd_IsComplement(bCube) );
        // make sure it is a cube
        assert( (Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) || // bCube0 == 0
                (Cudd_IsComplement(bCube1) && Cudd_Regular(bCube1)->index == CUDD_CONST_INDEX) ); // bCube1 == 0
        // quit if it is the last one
        if ( Cudd_Regular(bCube)->index == iVar )
            return (int)(Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX);
        // get the next cube
        if ( (Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) )
            bCube = bCube1;
        else
            bCube = bCube0;
    }
    return -1;
}